

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::Address::Set
          (Error *__return_storage_ptr__,Address *this,sockaddr_storage *aSockAddr)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  string_view fmt;
  format_args args;
  uint8_t *raw_1;
  sockaddr_in6 *addr6;
  uint8_t *raw;
  sockaddr_in *addr4;
  anon_class_1_0_00000001 local_122;
  v10 local_121;
  v10 *local_120;
  size_t local_118;
  string local_110;
  Error local_f0;
  undefined1 local_c1;
  sockaddr_storage *local_c0;
  sockaddr_storage *aSockAddr_local;
  Address *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_c1 = 0;
  local_c0 = aSockAddr;
  aSockAddr_local = (sockaddr_storage *)this;
  this_local = (Address *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  if ((local_c0->ss_family == 2) || (local_c0->ss_family == 10)) {
    if (local_c0->ss_family == 2) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::assign<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,
                 (uchar *)(local_c0->__ss_padding + 2),(uchar *)(local_c0->__ss_padding + 6));
    }
    else {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::assign<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,
                 (uchar *)(local_c0->__ss_padding + 6),(uchar *)(local_c0->__ss_padding + 0x16));
    }
  }
  else {
    Set::anon_class_1_0_00000001::operator()(&local_122);
    local_58 = &local_120;
    local_60 = &local_121;
    bVar1 = ::fmt::v10::operator()(local_60);
    local_118 = bVar1.size_;
    local_120 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_110;
    local_78 = local_120;
    sStack_70 = local_118;
    local_50 = &local_78;
    local_88 = local_120;
    local_80 = local_118;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_110,local_88,fmt,args);
    Error::Error(&local_f0,kInvalidArgs,&local_110);
    Error::operator=(__return_storage_ptr__,&local_f0);
    Error::~Error(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Address::Set(const sockaddr_storage &aSockAddr)
{
    Error error;

    VerifyOrExit(aSockAddr.ss_family == AF_INET || aSockAddr.ss_family == AF_INET6,
                 error = ERROR_INVALID_ARGS("only AF_INET and AF_INET6 address families are supported"));

    if (aSockAddr.ss_family == AF_INET)
    {
        auto &addr4 = *reinterpret_cast<const sockaddr_in *>(&aSockAddr);
        auto  raw   = reinterpret_cast<const uint8_t *>(&addr4.sin_addr);
        mBytes.assign(raw, raw + sizeof(addr4.sin_addr));
    }
    else
    {
        auto &addr6 = *reinterpret_cast<const sockaddr_in6 *>(&aSockAddr);
        auto  raw   = reinterpret_cast<const uint8_t *>(&addr6.sin6_addr);
        mBytes.assign(raw, raw + sizeof(addr6.sin6_addr));
    }

exit:
    return error;
}